

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O1

void polyscope::render::backend_openGL_mock::initializeRenderEngine(void)

{
  MockGLEngine *this;
  
  this = (MockGLEngine *)operator_new(0x310);
  MockGLEngine::MockGLEngine(this);
  glEngine = this;
  MockGLEngine::initialize(this);
  engine = glEngine;
  Engine::allocateGlobalBuffersAndPrograms(&glEngine->super_Engine);
  return;
}

Assistant:

void initializeRenderEngine() {
  glEngine = new MockGLEngine();
  glEngine->initialize();
  engine = glEngine;
  engine->allocateGlobalBuffersAndPrograms();
}